

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall DReachabilityPropagator::add_innode(DReachabilityPropagator *this,int i)

{
  iterator __position;
  int iVar1;
  int local_2c;
  TrailElem local_28;
  
  local_28.pt = &(this->in_nodes_tsize).v;
  local_28.x = (this->in_nodes_tsize).v;
  iVar1 = local_28.x + 1;
  local_28.sz = 4;
  local_2c = i;
  vec<TrailElem>::push(&engine.trail,&local_28);
  (this->in_nodes_tsize).v = iVar1;
  this->in_nodes_size = this->in_nodes_size + 1;
  __position._M_current =
       (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->in_nodes_list,__position,&local_2c);
  }
  else {
    *__position._M_current = i;
    (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void DReachabilityPropagator::add_innode(int i) {
	if (DEBUG) {
		std::cout << "Adding innode " << i << '\n';
	}
	assert(getNodeVar(i).isFixed());
	assert(getNodeVar(i).isTrue());
	in_nodes_tsize++;
	in_nodes_size++;
	in_nodes_list.push_back(i);
}